

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::StringParameter::MergeFrom(StringParameter *this,StringParameter *from)

{
  void *pvVar1;
  string *initial_value;
  string *psVar2;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/Parameters.pb.cc"
               ,0x3d9);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  initial_value = (from->defaultvalue_).ptr_;
  if ((initial_value->_M_string_length != 0) &&
     (psVar2 = (this->defaultvalue_).ptr_, psVar2 != initial_value)) {
    if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&this->defaultvalue_,initial_value);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar2);
    }
  }
  return;
}

Assistant:

void StringParameter::MergeFrom(const StringParameter& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.StringParameter)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.defaultvalue().size() > 0) {

    defaultvalue_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.defaultvalue_);
  }
}